

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_addq_8_al(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  
  uVar2 = (m68ki_cpu.ir >> 9) - 1 & 7;
  address = m68ki_read_imm_32();
  uVar1 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.x_flag = uVar2 + uVar1 + 1;
  m68ki_cpu.v_flag = (uVar1 ^ m68ki_cpu.x_flag) & (uVar2 + 1 ^ m68ki_cpu.x_flag);
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_addq_8_al(void)
{
	uint src = (((REG_IR >> 9) - 1) & 7) + 1;
	uint ea = EA_AL_8();
	uint dst = m68ki_read_8(ea);
	uint res = src + dst;

	FLAG_N = NFLAG_8(res);
	FLAG_V = VFLAG_ADD_8(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	m68ki_write_8(ea, FLAG_Z);
}